

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O0

void __thiscall correctness_negation_int_min_Test::TestBody(correctness_negation_int_min_Test *this)

{
  bool bVar1;
  AssertionResult gtest_ar;
  big_integer b;
  big_integer a;
  big_integer *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  big_integer *this_00;
  undefined4 in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  big_integer *in_stack_fffffffffffffeb0;
  Type in_stack_fffffffffffffebc;
  AssertHelper *in_stack_fffffffffffffec0;
  Message *in_stack_ffffffffffffff08;
  AssertHelper *in_stack_ffffffffffffff10;
  big_integer *in_stack_ffffffffffffff68;
  big_integer local_40;
  
  std::numeric_limits<int>::min();
  this_00 = &local_40;
  big_integer::big_integer(this_00,in_stack_fffffffffffffe9c);
  big_integer::operator-(in_stack_ffffffffffffff68);
  std::numeric_limits<int>::max();
  big_integer::big_integer
            (in_stack_fffffffffffffeb0,
             (big_integer *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  big_integer::big_integer(this_00,in_stack_fffffffffffffe9c);
  ::operator-((big_integer *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),this_00);
  testing::internal::EqHelper<false>::Compare<int,big_integer>
            ((char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),&this_00->sign,
             (int *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
             in_stack_fffffffffffffe90);
  big_integer::~big_integer(in_stack_fffffffffffffe90);
  big_integer::~big_integer(in_stack_fffffffffffffe90);
  big_integer::~big_integer(in_stack_fffffffffffffe90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffff68);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffec0);
    in_stack_fffffffffffffe90 =
         (big_integer *)testing::AssertionResult::failure_message((AssertionResult *)0x11a193);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,&in_stack_fffffffffffffeb0->sign,
               in_stack_fffffffffffffeac,&this_00->sign);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe90);
    testing::Message::~Message((Message *)0x11a1e1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11a230);
  big_integer::~big_integer(in_stack_fffffffffffffe90);
  big_integer::~big_integer(in_stack_fffffffffffffe90);
  return;
}

Assistant:

TEST(correctness, negation_int_min)
{
    big_integer a = std::numeric_limits<int>::min();
    big_integer b = -a;

    EXPECT_EQ(std::numeric_limits<int>::max(), b - 1);
}